

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondZvol.cpp
# Opt level: O1

void __thiscall OpenMD::HBondZvol::process(HBondZvol *this)

{
  int *piVar1;
  double dVar2;
  char cVar3;
  SimInfo *info;
  Snapshot *this_00;
  iterator __position;
  pointer pdVar4;
  RealType RVar5;
  double dVar6;
  uint i;
  int iVar7;
  Molecule *pMVar8;
  Molecule *pMVar9;
  HBondDonor *pHVar10;
  Atom *pAVar11;
  double *pdVar12;
  long lVar13;
  pointer ppAVar14;
  pointer ppHVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  double tmp;
  double tmp_2;
  double dVar19;
  Vector3d DH;
  Vector3d hPos;
  int jj;
  int ii;
  Vector3d DA;
  Vector3d dPos;
  Vector3d mPos;
  Vector3d aPos;
  Mat3x3d hmat;
  DumpReader reader;
  double local_13f8 [4];
  Vector3d local_13d8;
  Vector3d local_13b8;
  int local_1394;
  int local_1390;
  int local_138c;
  Vector3d local_1388;
  double local_1368 [4];
  SelectionManager *local_1348;
  SelectionManager *local_1340;
  Molecule *local_1338;
  double local_1330;
  double local_1328;
  SelectionSet local_1320;
  double local_1308 [3];
  vector<double,std::allocator<double>> *local_12f0;
  SelectionEvaluator *local_12e8;
  SelectionEvaluator *local_12e0;
  ulong local_12d8;
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  local_1368[0] = 0.0;
  local_1368[1] = 0.0;
  local_1368[2] = 0.0;
  local_1308[2] = 0.0;
  local_1308[0] = 0.0;
  local_1308[1] = 0.0;
  local_13b8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_13b8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_13b8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_13d8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_13d8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_13d8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_1388.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1388.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1388.super_Vector<double,_3U>.data_[1] = 0.0;
  info = (this->super_StaticAnalyser).info_;
  cVar3 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  local_1394 = DumpReader::getNFrames(&local_1288);
  this->frameCounter_ = 0;
  if (0 < local_1394) {
    local_12f0 = (vector<double,std::allocator<double>> *)&this->zBox_;
    local_12e0 = &this->evaluator1_;
    local_12e8 = &this->evaluator2_;
    local_1348 = &this->seleMan1_;
    local_1340 = &this->seleMan2_;
    uVar17 = 0;
    do {
      DumpReader::readFrame(&local_1288,(int)uVar17);
      this_00 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      this->currentSnapshot_ = this_00;
      Snapshot::getHmat(&local_12d0,this_00);
      pdVar12 = (double *)
                ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_ + (ulong)(uint)this->axis_ * 0x20);
      __position._M_current =
           (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_12f0,__position,pdVar12);
      }
      else {
        *__position._M_current = *pdVar12;
        (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      RVar5 = Snapshot::getVolume(this->currentSnapshot_);
      uVar16 = (this->super_StaticAnalyser).nBins_;
      local_1328 = *(double *)
                    ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                           .data_ + (ulong)(uint)this->axis_ * 0x20) * 0.5;
      if ((this->evaluator1_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1320,local_12e0);
        lVar18 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan1_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_> + lVar18),
                     (vector<bool,_std::allocator<bool>_> *)
                     ((long)&((local_1320.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar18));
          lVar18 = lVar18 + 0x28;
        } while (lVar18 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1320.bitsets_);
      }
      if ((this->evaluator2_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1320,local_12e8);
        lVar18 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan2_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_> + lVar18),
                     (vector<bool,_std::allocator<bool>_> *)
                     ((long)&((local_1320.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar18));
          lVar18 = lVar18 + 0x28;
        } while (lVar18 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1320.bitsets_);
      }
      pMVar8 = SelectionManager::beginSelectedMolecule(local_1348,&local_138c);
      local_1330 = 1.0 / (RVar5 / (double)uVar16);
      local_12d8 = uVar17;
      while (pMVar8 != (Molecule *)0x0) {
        Molecule::getCom((Vector3d *)&local_1320,pMVar8);
        pMVar9 = SelectionManager::beginSelectedMolecule(local_1340,&local_1390);
        local_1338 = pMVar8;
        while (pMVar9 != (Molecule *)0x0) {
          ppHVar15 = (pMVar8->hBondDonors_).
                     super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          while( true ) {
            if (ppHVar15 ==
                (pMVar8->hBondDonors_).
                super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pHVar10 = (HBondDonor *)0x0;
            }
            else {
              pHVar10 = *ppHVar15;
            }
            if (pHVar10 == (HBondDonor *)0x0) break;
            pAVar11 = pHVar10->donorAtom;
            lVar18 = *(long *)((long)&(((pAVar11->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar11->super_StuntDouble).storage_);
            lVar13 = (long)(pAVar11->super_StuntDouble).localIndex_;
            local_1368[2] = (double)*(undefined8 *)(lVar18 + 0x10 + lVar13 * 0x18);
            pdVar12 = (double *)(lVar18 + lVar13 * 0x18);
            local_1368[0] = *pdVar12;
            local_1368[1] = pdVar12[1];
            pAVar11 = pHVar10->donatedHydrogen;
            lVar18 = *(long *)((long)&(((pAVar11->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar11->super_StuntDouble).storage_);
            lVar13 = (long)(pAVar11->super_StuntDouble).localIndex_;
            pdVar12 = (double *)(lVar18 + lVar13 * 0x18);
            local_13b8.super_Vector<double,_3U>.data_[2] =
                 *(double *)(lVar18 + 0x10 + lVar13 * 0x18);
            local_13b8.super_Vector<double,_3U>.data_[0] = *pdVar12;
            local_13b8.super_Vector<double,_3U>.data_[1] = pdVar12[1];
            local_13f8[0] = 0.0;
            local_13f8[1] = 0.0;
            local_13f8[2] = 0.0;
            lVar18 = 0;
            do {
              local_13f8[lVar18] =
                   local_13b8.super_Vector<double,_3U>.data_[lVar18] - local_1368[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            local_13d8.super_Vector<double,_3U>.data_[2] = local_13f8[2];
            local_13d8.super_Vector<double,_3U>.data_[0] = local_13f8[0];
            local_13d8.super_Vector<double,_3U>.data_[1] = local_13f8[1];
            Snapshot::wrapVector(this->currentSnapshot_,&local_13d8);
            dVar6 = 0.0;
            lVar18 = 0;
            do {
              dVar2 = local_13d8.super_Vector<double,_3U>.data_[lVar18];
              dVar6 = dVar6 + dVar2 * dVar2;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            if (dVar6 < 0.0) {
              dVar6 = sqrt(dVar6);
            }
            else {
              dVar6 = SQRT(dVar6);
            }
            ppAVar14 = (pMVar9->hBondAcceptors_).
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            while( true ) {
              if (ppAVar14 ==
                  (pMVar9->hBondAcceptors_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                pAVar11 = (Atom *)0x0;
              }
              else {
                pAVar11 = *ppAVar14;
              }
              if (pAVar11 == (Atom *)0x0) break;
              lVar18 = *(long *)((long)&(((pAVar11->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar11->super_StuntDouble).storage_);
              lVar13 = (long)(pAVar11->super_StuntDouble).localIndex_;
              local_1308[2] = (double)*(undefined8 *)(lVar18 + 0x10 + lVar13 * 0x18);
              pdVar12 = (double *)(lVar18 + lVar13 * 0x18);
              local_1308[0] = *pdVar12;
              local_1308[1] = pdVar12[1];
              local_13f8[0] = 0.0;
              local_13f8[1] = 0.0;
              local_13f8[2] = 0.0;
              lVar18 = 0;
              do {
                local_13f8[lVar18] = local_1308[lVar18] - local_1368[lVar18];
                lVar18 = lVar18 + 1;
              } while (lVar18 != 3);
              local_1388.super_Vector<double,_3U>.data_[2] = local_13f8[2];
              local_1388.super_Vector<double,_3U>.data_[0] = local_13f8[0];
              local_1388.super_Vector<double,_3U>.data_[1] = local_13f8[1];
              Snapshot::wrapVector(this->currentSnapshot_,&local_1388);
              dVar2 = 0.0;
              lVar18 = 0;
              do {
                dVar19 = local_1388.super_Vector<double,_3U>.data_[lVar18];
                dVar2 = dVar2 + dVar19 * dVar19;
                lVar18 = lVar18 + 1;
              } while (lVar18 != 3);
              if (dVar2 < 0.0) {
                dVar2 = sqrt(dVar2);
              }
              else {
                dVar2 = SQRT(dVar2);
              }
              if (dVar2 < this->rCut_) {
                dVar19 = 0.0;
                lVar18 = 0;
                do {
                  dVar19 = dVar19 + local_13d8.super_Vector<double,_3U>.data_[lVar18] *
                                    local_1388.super_Vector<double,_3U>.data_[lVar18];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 3);
                dVar2 = acos(dVar19 / (dVar2 * dVar6));
                if ((dVar2 * 180.0) / 3.141592653589793 < this->thetaCut_) {
                  if (cVar3 != '\0') {
                    Snapshot::wrapVector(this->currentSnapshot_,&local_13b8);
                  }
                  iVar7 = (int)(((local_13b8.super_Vector<double,_3U>.data_[(uint)this->axis_] +
                                 local_1328) * (double)(this->super_StaticAnalyser).nBins_) /
                               *(double *)
                                ((long)local_12d0.super_SquareMatrix<double,_3>.
                                       super_RectMatrix<double,_3U,_3U>.data_ +
                                (ulong)(uint)this->axis_ * 0x20));
                  pdVar4 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar4[iVar7] = pdVar4[iVar7] + local_1330;
                  piVar1 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start + iVar7;
                  *piVar1 = *piVar1 + 1;
                }
              }
              ppAVar14 = ppAVar14 + 1;
            }
            ppHVar15 = ppHVar15 + 1;
            pMVar8 = local_1338;
          }
          ppAVar14 = (pMVar8->hBondAcceptors_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (ppAVar14 ==
              (pMVar8->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pAVar11 = (Atom *)0x0;
          }
          else {
            pAVar11 = *ppAVar14;
          }
          while (pAVar11 != (Atom *)0x0) {
            lVar18 = *(long *)((long)&(((pAVar11->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar11->super_StuntDouble).storage_);
            lVar13 = (long)(pAVar11->super_StuntDouble).localIndex_;
            local_1308[2] = (double)*(undefined8 *)(lVar18 + 0x10 + lVar13 * 0x18);
            pdVar12 = (double *)(lVar18 + lVar13 * 0x18);
            local_1308[0] = *pdVar12;
            local_1308[1] = pdVar12[1];
            ppHVar15 = (pMVar9->hBondDonors_).
                       super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            while( true ) {
              if (ppHVar15 ==
                  (pMVar9->hBondDonors_).
                  super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                pHVar10 = (HBondDonor *)0x0;
              }
              else {
                pHVar10 = *ppHVar15;
              }
              if (pHVar10 == (HBondDonor *)0x0) break;
              pAVar11 = pHVar10->donorAtom;
              lVar18 = *(long *)((long)&(((pAVar11->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar11->super_StuntDouble).storage_);
              lVar13 = (long)(pAVar11->super_StuntDouble).localIndex_;
              local_1368[2] = (double)*(undefined8 *)(lVar18 + 0x10 + lVar13 * 0x18);
              pdVar12 = (double *)(lVar18 + lVar13 * 0x18);
              local_1368[0] = *pdVar12;
              local_1368[1] = pdVar12[1];
              local_13f8[0] = 0.0;
              local_13f8[1] = 0.0;
              local_13f8[2] = 0.0;
              lVar18 = 0;
              do {
                local_13f8[lVar18] = local_1308[lVar18] - local_1368[lVar18];
                lVar18 = lVar18 + 1;
              } while (lVar18 != 3);
              local_1388.super_Vector<double,_3U>.data_[2] = local_13f8[2];
              local_1388.super_Vector<double,_3U>.data_[0] = local_13f8[0];
              local_1388.super_Vector<double,_3U>.data_[1] = local_13f8[1];
              Snapshot::wrapVector(this->currentSnapshot_,&local_1388);
              dVar6 = 0.0;
              lVar18 = 0;
              do {
                dVar2 = local_1388.super_Vector<double,_3U>.data_[lVar18];
                dVar6 = dVar6 + dVar2 * dVar2;
                lVar18 = lVar18 + 1;
              } while (lVar18 != 3);
              if (dVar6 < 0.0) {
                dVar6 = sqrt(dVar6);
              }
              else {
                dVar6 = SQRT(dVar6);
              }
              if (dVar6 < this->rCut_) {
                pAVar11 = pHVar10->donatedHydrogen;
                lVar18 = *(long *)((long)&(((pAVar11->super_StuntDouble).snapshotMan_)->
                                           currentSnapshot_->atomData).position.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  (pAVar11->super_StuntDouble).storage_);
                lVar13 = (long)(pAVar11->super_StuntDouble).localIndex_;
                pdVar12 = (double *)(lVar18 + lVar13 * 0x18);
                local_13b8.super_Vector<double,_3U>.data_[2] =
                     *(double *)(lVar18 + 0x10 + lVar13 * 0x18);
                local_13b8.super_Vector<double,_3U>.data_[0] = *pdVar12;
                local_13b8.super_Vector<double,_3U>.data_[1] = pdVar12[1];
                local_13f8[0] = 0.0;
                local_13f8[1] = 0.0;
                local_13f8[2] = 0.0;
                lVar18 = 0;
                do {
                  local_13f8[lVar18] =
                       local_13b8.super_Vector<double,_3U>.data_[lVar18] - local_1368[lVar18];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 3);
                local_13d8.super_Vector<double,_3U>.data_[2] = local_13f8[2];
                local_13d8.super_Vector<double,_3U>.data_[0] = local_13f8[0];
                local_13d8.super_Vector<double,_3U>.data_[1] = local_13f8[1];
                Snapshot::wrapVector(this->currentSnapshot_,&local_13d8);
                dVar2 = 0.0;
                lVar18 = 0;
                do {
                  dVar19 = local_13d8.super_Vector<double,_3U>.data_[lVar18];
                  dVar2 = dVar2 + dVar19 * dVar19;
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 3);
                if (dVar2 < 0.0) {
                  dVar2 = sqrt(dVar2);
                }
                else {
                  dVar2 = SQRT(dVar2);
                }
                dVar19 = 0.0;
                lVar18 = 0;
                do {
                  dVar19 = dVar19 + local_13d8.super_Vector<double,_3U>.data_[lVar18] *
                                    local_1388.super_Vector<double,_3U>.data_[lVar18];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 3);
                dVar6 = acos(dVar19 / (dVar6 * dVar2));
                if ((dVar6 * 180.0) / 3.141592653589793 < this->thetaCut_) {
                  if (cVar3 != '\0') {
                    Snapshot::wrapVector(this->currentSnapshot_,&local_13b8);
                  }
                  iVar7 = (int)(((local_13b8.super_Vector<double,_3U>.data_[(uint)this->axis_] +
                                 local_1328) * (double)(this->super_StaticAnalyser).nBins_) /
                               *(double *)
                                ((long)local_12d0.super_SquareMatrix<double,_3>.
                                       super_RectMatrix<double,_3U,_3U>.data_ +
                                (ulong)(uint)this->axis_ * 0x20));
                  pdVar4 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar4[iVar7] = pdVar4[iVar7] + local_1330;
                  piVar1 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start + iVar7;
                  *piVar1 = *piVar1 + 1;
                }
              }
              ppHVar15 = ppHVar15 + 1;
            }
            ppAVar14 = ppAVar14 + 1;
            pMVar8 = local_1338;
            if (ppAVar14 ==
                (local_1338->hBondAcceptors_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pAVar11 = (Atom *)0x0;
            }
            else {
              pAVar11 = *ppAVar14;
            }
          }
          pMVar9 = SelectionManager::nextSelectedMolecule(local_1340,&local_1390);
          uVar17 = local_12d8;
        }
        pMVar8 = SelectionManager::nextSelectedMolecule(local_1348,&local_138c);
      }
      uVar16 = (int)uVar17 + (this->super_StaticAnalyser).step_;
      uVar17 = (ulong)uVar16;
    } while ((int)uVar16 < local_1394);
  }
  writeDensity(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void HBondZvol::process() {
    Molecule* mol1;
    Molecule* mol2;
    Molecule::HBondDonor* hbd1;
    Molecule::HBondDonor* hbd2;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    std::vector<Molecule::HBondDonor*>::iterator hbdj;
    std::vector<Atom*>::iterator hbai;
    std::vector<Atom*>::iterator hbaj;
    Atom* hba1;
    Atom* hba2;
    Vector3d dPos;
    Vector3d aPos;
    Vector3d hPos;
    Vector3d DH;
    Vector3d DA;
    RealType DAdist, DHdist, theta, ctheta;
    int ii, jj;
    int nHB, nA, nD;
    RealType sliceVol;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames   = reader.getNFrames();
    frameCounter_ = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Mat3x3d hmat = currentSnapshot_->getHmat();

      RealType Lx = hmat(0, 0);
      RealType Ly = hmat(1, 1);
      RealType Lz = hmat(2, 2);

      zBox_.push_back(hmat(axis_, axis_));
      sliceVol = currentSnapshot_->getVolume() / nBins_;

      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
      }

      for (mol1 = seleMan1_.beginSelectedMolecule(ii); mol1 != NULL;
           mol1 = seleMan1_.nextSelectedMolecule(ii)) {
        // We're collecting statistics on the molecules in selection 1:
        nHB           = 0;
        nA            = 0;
        nD            = 0;
        Vector3d mPos = mol1->getCom();

        for (mol2 = seleMan2_.beginSelectedMolecule(jj); mol2 != NULL;
             mol2 = seleMan2_.nextSelectedMolecule(jj)) {
          // loop over the possible donors in molecule 1:
          for (hbd1 = mol1->beginHBondDonor(hbdi); hbd1 != NULL;
               hbd1 = mol1->nextHBondDonor(hbdi)) {
            dPos = hbd1->donorAtom->getPos();
            hPos = hbd1->donatedHydrogen->getPos();
            DH   = hPos - dPos;
            currentSnapshot_->wrapVector(DH);
            DHdist = DH.length();

            // loop over the possible acceptors in molecule 2:
            for (hba2 = mol2->beginHBondAcceptor(hbaj); hba2 != NULL;
                 hba2 = mol2->nextHBondAcceptor(hbaj)) {
              aPos = hba2->getPos();
              DA   = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < rCut_) {
                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;

                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_) {
                  // molecule 1 is a Hbond donor:
                  nHB++;
                  nD++;
                  if (usePeriodicBoundaryConditions_)
                    currentSnapshot_->wrapVector(hPos);
                  int binNo = int(nBins_ * (halfBoxZ_ + hPos[axis_]) /
                                  hmat(axis_, axis_));
                  sliceQ_[binNo] += 1 / sliceVol;
                  sliceCount_[binNo] += 1;
                }
              }
            }
          }

          // now loop over the possible acceptors in molecule 1:
          for (hba1 = mol1->beginHBondAcceptor(hbai); hba1 != NULL;
               hba1 = mol1->nextHBondAcceptor(hbai)) {
            aPos = hba1->getPos();

            // loop over the possible donors in molecule 2:
            for (hbd2 = mol2->beginHBondDonor(hbdj); hbd2 != NULL;
                 hbd2 = mol2->nextHBondDonor(hbdj)) {
              dPos = hbd2->donorAtom->getPos();

              DA = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < rCut_) {
                hPos = hbd2->donatedHydrogen->getPos();
                DH   = hPos - dPos;
                currentSnapshot_->wrapVector(DH);
                DHdist = DH.length();
                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;
                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_) {
                  // molecule 1 is a Hbond acceptor:
                  nHB++;
                  nA++;
                  if (usePeriodicBoundaryConditions_)
                    currentSnapshot_->wrapVector(hPos);
                  int binNo = int(nBins_ * (halfBoxZ_ + hPos[axis_]) /
                                  hmat(axis_, axis_));
                  sliceQ_[binNo] += 1 / sliceVol;
                  sliceCount_[binNo] += 1;
                }
              }
            }
          }
        }
      }
    }
    writeDensity();
  }